

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

void __thiscall ot::commissioner::JobManager::RunJobs(JobManager *this)

{
  bool bVar1;
  reference ppJVar2;
  bool condition;
  Job *job;
  iterator __end2;
  iterator __begin2;
  JobPool *__range2;
  JobManager *this_local;
  
  __end2 = std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::begin
                     (&this->mJobPool);
  job = (Job *)std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::end
                         (&this->mJobPool);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                                *)&job);
    if (!bVar1) {
      WaitForJobs(this);
      return;
    }
    ppJVar2 = __gnu_cxx::
              __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
              ::operator*(&__end2);
    if (*ppJVar2 == (Job *)0x0) break;
    Job::Run(*ppJVar2);
    __gnu_cxx::
    __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x277,"void ot::commissioner::JobManager::RunJobs()");
}

Assistant:

void JobManager::RunJobs()
{
    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Run();
    }
    WaitForJobs();
}